

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

void __thiscall
Disa::Adjacency_Graph<true>::Adjacency_Graph
          (Adjacency_Graph<true> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  Edge *pEVar1;
  Edge *pEVar2;
  Edge *pEVar3;
  long lVar4;
  size_t size_edge;
  Edge *pEVar5;
  Edge *edge;
  const_iterator __begin2;
  
  size_edge = edge_graph._M_len;
  edge = edge_graph._M_array;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar5 = edge;
  if (size_edge != 0) {
    lVar4 = size_edge << 4;
    pEVar3 = edge;
    pEVar1 = edge;
    while( true ) {
      pEVar5 = pEVar3;
      pEVar3 = pEVar1 + 1;
      lVar4 = lVar4 + -0x10;
      if (lVar4 == 0) break;
      pEVar2 = pEVar1 + 1;
      pEVar1 = pEVar3;
      if (pEVar2->second <= pEVar5->second) {
        pEVar3 = pEVar5;
      }
    }
  }
  reserve(this,pEVar5->first,size_edge);
  for (lVar4 = size_edge << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
    insert(this,edge);
    edge = edge + 1;
  }
  shrink_to_fit(this);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}